

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool util::HasPrefix<Span<unsigned_char_const>,6ul>
               (Span<const_unsigned_char> *obj,array<unsigned_char,_6UL> *prefix)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (obj->m_size < 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return false;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = std::__equal<true>::equal<unsigned_char>
                      (prefix->_M_elems,prefix[1]._M_elems,obj->m_data);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] inline bool HasPrefix(const T1& obj,
                                const std::array<uint8_t, PREFIX_LEN>& prefix)
{
    return obj.size() >= PREFIX_LEN &&
           std::equal(std::begin(prefix), std::end(prefix), std::begin(obj));
}